

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O1

double __thiscall BMRS<UF>::Alloc(BMRS<UF> *this)

{
  uint uVar1;
  double dVar2;
  uint uVar3;
  Mat1b *pMVar4;
  int *piVar5;
  Mat1i *pMVar6;
  int iVar7;
  long lVar8;
  uint64_t *puVar9;
  Run *pRVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar7 = *(int *)&pMVar4->field_0x8;
  iVar12 = *(int *)&pMVar4->field_0xc;
  dVar14 = UF::Alloc(((iVar12 - (iVar12 + 1 >> 0x1f)) + 1 >> 1) *
                     ((iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1) + 1,
                     &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar7 = *(int *)&pMVar4->field_0x8;
  uVar3 = *(uint *)&pMVar4->field_0xc;
  lVar8 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar8;
  piVar5 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar5,piVar5[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  uVar1 = iVar7 / 2 + iVar7 % 2;
  cv::Mat::~Mat(local_90);
  (this->data_compressed).height = iVar7;
  (this->data_compressed).width = uVar3;
  uVar11 = uVar3 + 0x3f;
  if (-1 < (int)uVar3) {
    uVar11 = uVar3;
  }
  iVar12 = ((int)uVar11 >> 6) + 1;
  (this->data_compressed).data_width = iVar12;
  uVar13 = (long)(iVar7 * iVar12) * 8;
  if (iVar7 * iVar12 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  puVar9 = (uint64_t *)operator_new__(uVar13);
  (this->data_compressed).bits = puVar9;
  (this->data_merged).height = uVar1;
  (this->data_merged).width = uVar3;
  (this->data_merged).data_width = iVar12;
  uVar13 = (long)(int)(uVar1 * iVar12) * 8;
  if ((int)(uVar1 * iVar12) < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  puVar9 = (uint64_t *)operator_new__(uVar13);
  (this->data_merged).bits = puVar9;
  iVar7 = iVar7 / 2 + iVar7 % 2 + -1;
  (this->data_flags).height = iVar7;
  (this->data_flags).width = uVar3;
  (this->data_flags).data_width = iVar12;
  iVar12 = iVar12 * iVar7;
  uVar13 = (long)iVar12 * 8;
  if (iVar12 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  puVar9 = (uint64_t *)operator_new__(uVar13);
  (this->data_flags).bits = puVar9;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  memset((this->data_compressed).bits,0,
         (long)(this->data_compressed).data_width * (long)(this->data_compressed).height * 8);
  memset((this->data_merged).bits,0,
         (long)(this->data_merged).data_width * (long)(this->data_merged).height * 8);
  memset((this->data_flags).bits,0,
         (long)(this->data_flags).data_width * (long)(this->data_flags).height * 8);
  lVar8 = cv::getTickCount();
  dVar16 = (double)lVar8 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar16;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar16;
  dVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  (this->data_runs).height = uVar1;
  (this->data_runs).width = uVar3;
  pRVar10 = (Run *)operator_new__((ulong)(((uVar3 >> 1) + 2) * uVar1 + 1) << 3);
  (this->data_runs).runs = pRVar10;
  lVar8 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar8;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  memset((this->data_compressed).bits,0,
         (long)(this->data_compressed).data_width * (long)(this->data_compressed).height * 8);
  memset((this->data_merged).bits,0,
         (long)(this->data_merged).data_width * (long)(this->data_merged).height * 8);
  memset((this->data_flags).bits,0,
         (long)(this->data_flags).data_width * (long)(this->data_flags).height * 8);
  lVar8 = cv::getTickCount();
  dVar15 = (double)lVar8 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar15;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar15;
  return dVar14 + ((dVar16 * 1000.0) / dVar2 -
                  (dVar15 * 1000.0) /
                  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                  tick_frequency_);
}

Assistant:

double Alloc() {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);

        int w(img_.cols);
        int h(img_.rows);
        int h_merge = h / 2 + h % 2;

        // Memory allocation for others
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        data_compressed.Alloc(h, w);
        data_merged.Alloc(h_merge, w);
        data_flags.Alloc(h_merge - 1, w);
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        memset(data_merged.bits, 0, data_merged.height * data_merged.data_width * sizeof(uint64_t));
        memset(data_flags.bits, 0, data_flags.height * data_flags.data_width * sizeof(uint64_t));
        perf_.stop();
        double t = perf_.last();

        // Run metadata allocation time will be calculated later
        data_runs.Alloc(h_merge, w);

        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        memset(data_merged.bits, 0, data_merged.height * data_merged.data_width * sizeof(uint64_t));
        memset(data_flags.bits, 0, data_flags.height * data_flags.data_width * sizeof(uint64_t));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }